

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fits_strncasecmp(char *s1,char *s2,size_t n)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  char cVar4;
  size_t sVar5;
  
  sVar5 = 0;
  while( true ) {
    if (n == sVar5) {
      return 0;
    }
    pp_Var3 = __ctype_toupper_loc();
    uVar2 = (*pp_Var3)[s1[sVar5]];
    cVar1 = (char)(*pp_Var3)[s2[sVar5]];
    cVar4 = (char)uVar2;
    if (cVar4 < cVar1) {
      return -1;
    }
    if (cVar1 < cVar4) {
      return 1;
    }
    if ((uVar2 & 0xff) == 0) break;
    sVar5 = sVar5 + 1;
  }
  return 0;
}

Assistant:

int fits_strncasecmp(const char *s1, const char *s2, size_t n)
{
   char c1, c2;

   for (; n-- ;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
   return(0);
}